

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,__va_list_tag *args)

{
  long lVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = args->gp_offset;
  if ((ulong)uVar3 < 0x29) {
    puVar2 = (undefined8 *)((ulong)uVar3 + (long)args->reg_save_area);
    args->gp_offset = uVar3 + 8;
  }
  else {
    puVar2 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar2 + 1;
  }
  if ((int *)*puVar2 == (int *)0x0) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (ctx->frame_worker == (AVxWorker *)0x0) {
    return AOM_CODEC_ERROR;
  }
  lVar1 = *(long *)(*ctx->frame_worker->data1 + 0x9be8);
  iVar4 = *(int *)(lVar1 + 100);
  if (iVar4 == 0 && *(uint *)(lVar1 + 0x60) == 0) {
    iVar5 = 0x106;
  }
  else {
    uVar3 = *(uint *)(lVar1 + 0x60) ^ 1;
    iVar5 = 0x105;
    if (uVar3 != 0 || iVar4 != 0) {
      iVar5 = 0x102;
      if (uVar3 != 0 || iVar4 != 1) {
        iVar5 = 0;
      }
    }
  }
  iVar4 = iVar5 + 0x800;
  if (*(char *)(lVar1 + 0x4c) == '\0') {
    iVar4 = iVar5;
  }
  *(int *)*puVar2 = iVar4;
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_get_img_format(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_img_fmt_t *const img_fmt = va_arg(args, aom_img_fmt_t *);
  AVxWorker *const worker = ctx->frame_worker;

  if (img_fmt) {
    if (worker) {
      FrameWorkerData *const frame_worker_data =
          (FrameWorkerData *)worker->data1;
      const AV1_COMMON *const cm = &frame_worker_data->pbi->common;

      *img_fmt = get_img_format(cm->seq_params->subsampling_x,
                                cm->seq_params->subsampling_y,
                                cm->seq_params->use_highbitdepth);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  }

  return AOM_CODEC_INVALID_PARAM;
}